

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_synth.cpp
# Opt level: O2

void __thiscall SaveButton::SaveButton(SaveButton *this)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Save raw",&local_31);
  ToggleButton::ToggleButton(&this->super_ToggleButton,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_ToggleButton).super_Button.super_Widget._vptr_Widget =
       (_func_int **)&PTR__Button_0010e600;
  return;
}

Assistant:

SaveButton() : ToggleButton("Save raw") {}